

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartitioningAroundMedoids.h
# Opt level: O0

void __thiscall
CPartitioningAroundMedois<CDissimilarityMatrix<float>_>::CPartitioningAroundMedois
          (CPartitioningAroundMedois<CDissimilarityMatrix<float>_> *this,
          DissimilarityMatrixType *dissimilarityMatrix,size_t _numberOfClusters)

{
  ulong uVar1;
  size_t sVar2;
  invalid_argument *this_00;
  size_t _numberOfClusters_local;
  DissimilarityMatrixType *dissimilarityMatrix_local;
  CPartitioningAroundMedois<CDissimilarityMatrix<float>_> *this_local;
  
  this->matrix = dissimilarityMatrix;
  this->numberOfClusters = _numberOfClusters;
  this->state = Initializing;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->medoids);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->objectMedoids);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->objectSecondMedoids);
  if (1 < this->numberOfClusters) {
    uVar1 = this->numberOfClusters;
    sVar2 = CDissimilarityMatrix<float>::Size(this->matrix);
    if (uVar1 <= sVar2) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                (&this->medoids,this->numberOfClusters);
      sVar2 = CDissimilarityMatrix<float>::Size(this->matrix);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&this->objectMedoids,sVar2)
      ;
      sVar2 = CDissimilarityMatrix<float>::Size(this->matrix);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (&this->objectSecondMedoids,sVar2);
      return;
    }
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"CPartitioningAroundMedois initializing failed");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

explicit CPartitioningAroundMedois( const DissimilarityMatrixType& dissimilarityMatrix,
			size_t _numberOfClusters ) :
		matrix( dissimilarityMatrix ),
		numberOfClusters( _numberOfClusters ),
		state( Initializing )
	{
		if( numberOfClusters < 2 || numberOfClusters > matrix.Size() ) {
			throw invalid_argument( "CPartitioningAroundMedois initializing failed" );
		}

		medoids.reserve( numberOfClusters );
		objectMedoids.resize( matrix.Size() );
		objectSecondMedoids.resize( matrix.Size() );
	}